

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O2

void pbrt::detail::
     stringPrintfRecursive<pbrt::HaltonPixelIndexer_const&,pbrt::Point2<int>const&,int_const&,int_const&,int_const&>
               (string *s,char *fmt,HaltonPixelIndexer *v,Point2<int> *args,int *args_1,int *args_2,
               int *args_3)

{
  long lVar1;
  long lVar2;
  long lVar3;
  HaltonPixelIndexer *v_00;
  char *s_00;
  int line;
  char *fmt_local;
  string local_220;
  string nextFmt;
  undefined8 local_1e0 [4];
  undefined8 local_1c0;
  stringstream ss;
  ostream local_1a8 [376];
  
  v_00 = (HaltonPixelIndexer *)args;
  fmt_local = fmt;
  copyToFormatString(&nextFmt,&fmt_local,s);
  lVar1 = std::__cxx11::string::find('\0',0x2a);
  lVar2 = std::__cxx11::string::find('\0',0x73);
  lVar3 = std::__cxx11::string::find('\0',100);
  if (lVar1 == -1) {
    if (lVar3 == -1) {
      if (lVar2 == -1) {
        if (nextFmt._M_string_length == 0) {
          s_00 = "Excess values passed to Printf.";
          line = 0x10d;
          goto LAB_003fe15f;
        }
        formatOne<pbrt::HaltonPixelIndexer_const&>
                  ((enable_if_t<std::is_class<typename_std::decay_t<const_HaltonPixelIndexer_&>_>::value,_std::string>
                    *)&ss,(detail *)nextFmt._M_dataplus._M_p,(char *)v,v_00);
        std::__cxx11::string::append((string *)s);
        std::__cxx11::string::~string((string *)&ss);
      }
      else {
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        HaltonPixelIndexer::ToString_abi_cxx11_(&local_220,v);
        std::operator<<(local_1a8,(string *)&local_220);
        std::__cxx11::string::~string((string *)&local_220);
        std::__cxx11::stringbuf::str();
        local_1c0 = local_1e0[0];
        formatOne<char_const*>
                  (&local_220,(detail *)nextFmt._M_dataplus._M_p,(char *)&local_1c0,(char **)v_00);
        std::__cxx11::string::append((string *)s);
        std::__cxx11::string::~string((string *)&local_220);
        std::__cxx11::string::~string((string *)local_1e0);
        std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      }
      stringPrintfRecursive<pbrt::Point2<int>const&,int_const&,int_const&,int_const&>
                (s,fmt_local,args,args_1,args_2,args_3);
      std::__cxx11::string::~string((string *)&nextFmt);
      return;
    }
    s_00 = "Non-integral type passed to %d format.";
    line = 0x104;
  }
  else {
    s_00 = "Non-integral type provided for %* format.";
    line = 0xe8;
  }
LAB_003fe15f:
  LogFatal(Fatal,
           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/print.h"
           ,line,s_00);
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&... args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same<std::decay_t<T>, float>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, double>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, bool>::value)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}